

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusTexGenMode::emulate_mthd(MthdCelsiusTexGenMode *this)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((int)uVar4 < 0x2402) {
    if (uVar4 == 0) goto LAB_0020c0d3;
    if (uVar4 == 0x2400) {
      uVar4 = 1;
      goto LAB_0020c0d3;
    }
    if (uVar4 == 0x2401) {
      uVar4 = 2;
      goto LAB_0020c0d3;
    }
  }
  else {
    if ((int)uVar4 < 0x8512) {
      if (uVar4 != 0x2402) {
        if (uVar4 == 0x8511) {
          uVar4 = 4;
          if (this->which < 3) goto LAB_0020c0d3;
          goto LAB_0020c09d;
        }
        goto LAB_0020c0c7;
      }
    }
    else {
      if (uVar4 == 0x8512) {
LAB_0020c09d:
        uVar4 = 5;
        if (this->which < 3) goto LAB_0020c0d3;
      }
      else if (uVar4 != 0x855f) goto LAB_0020c0c7;
      uVar4 = 6;
      if (this->which < 3) goto LAB_0020c0d3;
    }
    uVar4 = 3;
    if (this->which < 2) goto LAB_0020c0d3;
  }
LAB_0020c0c7:
  uVar5 = uVar5 | 1;
  uVar4 = 0;
LAB_0020c0d3:
  if (uVar5 == 0) {
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
      iVar2 = *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
      lVar1 = (ulong)(this->which != 3) * 4 + 3;
      bVar3 = (char)this->which * '\x03' + (char)(iVar2 << 4) + (char)iVar2 * -2 + 3;
      uVar4 = ((uint)lVar1 & uVar4) << (bVar3 & 0x3f) |
              ~(uint)(lVar1 << (bVar3 & 0x3f)) &
              (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar4;
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) ==
          0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar4
        ;
      }
    }
    return;
  }
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify;
  if ((uVar4 & 0x70000000) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.notify = uVar4 | uVar5 << 0x1c;
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0:
				rv = 0;
				break;
			case 0x2400:
				rv = 1;
				break;
			case 0x2401:
				rv = 2;
				break;
			case 0x8511:
				if (which < 3) {
					rv = 4;
					break;
				}
			case 0x8512:
				if (which < 3) {
					rv = 5;
					break;
				}
			case 0x855f:
				if (which < 3) {
					rv = 6;
					break;
				}
			case 0x2402:
				if (which < 2) {
					rv = 3;
					break;
				}
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.celsius_xf_misc_b, 3 + idx * 14 + which * 3, which == 3 ? 2 : 3, rv);
				if (!extr(exp.debug_d, 28, 1)) {
					exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
					exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
				}
			}
		}
	}